

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  int *piVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint8_t uVar9;
  byte bVar10;
  CordRepBtree *pCVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  OpResult OVar17;
  
  bVar10 = (this->super_CordRep).storage[2];
  bVar2 = (this->super_CordRep).storage[1];
  if ((ulong)bVar10 - (ulong)bVar2 < 6) {
    uVar14 = 0;
    pCVar11 = this;
    if (!owned) {
      sVar3 = (this->super_CordRep).length;
      pCVar11 = (CordRepBtree *)operator_new(0x40);
      (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar11->super_CordRep).length = sVar3;
      uVar14 = *(undefined8 *)((long)this->edges_ + 4);
      uVar5 = *(undefined8 *)((long)this->edges_ + 0xc);
      uVar6 = *(undefined8 *)((long)this->edges_ + 0x14);
      uVar7 = *(undefined8 *)((long)this->edges_ + 0x1c);
      uVar8 = *(undefined8 *)((long)this->edges_ + 0x24);
      *(undefined8 *)&(pCVar11->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
      *(undefined8 *)((long)pCVar11->edges_ + 4) = uVar14;
      *(undefined8 *)((long)pCVar11->edges_ + 0xc) = uVar5;
      *(undefined8 *)((long)pCVar11->edges_ + 0x14) = uVar6;
      *(undefined8 *)((long)pCVar11->edges_ + 0x1c) = uVar7;
      *(undefined8 *)((long)pCVar11->edges_ + 0x24) = uVar8;
      *(undefined4 *)((long)pCVar11->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
      uVar14 = 1;
      if (bVar2 != bVar10) {
        lVar16 = (ulong)bVar2 << 3;
        do {
          lVar4 = *(long *)((long)this->edges_ + lVar16);
          if (lVar4 == 0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          piVar1 = (int *)(lVar4 + 8);
          *piVar1 = *piVar1 + 2;
          UNLOCK();
          lVar16 = lVar16 + 8;
        } while ((ulong)bVar10 * 8 != lVar16);
      }
    }
    uVar13 = (ulong)(pCVar11->super_CordRep).storage[2];
    lVar16 = uVar13 - 6;
    if (lVar16 != 0) {
      uVar12 = (ulong)(pCVar11->super_CordRep).storage[1] - lVar16;
      (pCVar11->super_CordRep).storage[1] = (uint8_t)uVar12;
      (pCVar11->super_CordRep).storage[2] = '\x06';
      if (uVar12 < 6) {
        uVar15 = 5;
        do {
          pCVar11->edges_[uVar15] =
               *(CordRep **)((long)(&pCVar11->super_CordRep + -2) + uVar15 * 8 + uVar13 * 8);
          uVar15 = uVar15 - 1;
        } while (uVar12 <= uVar15);
      }
    }
    bVar10 = (pCVar11->super_CordRep).storage[1] - 1;
    (pCVar11->super_CordRep).storage[1] = bVar10;
    pCVar11->edges_[bVar10] = edge;
    (pCVar11->super_CordRep).length = (pCVar11->super_CordRep).length + delta;
  }
  else {
    pCVar11 = (CordRepBtree *)operator_new(0x40);
    (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    if (edge->tag == '\x03') {
      uVar9 = edge->storage[0] + '\x01';
    }
    else {
      uVar9 = '\0';
    }
    (pCVar11->super_CordRep).length = edge->length;
    (pCVar11->super_CordRep).tag = '\x03';
    (pCVar11->super_CordRep).storage[0] = uVar9;
    (pCVar11->super_CordRep).storage[1] = '\0';
    (pCVar11->super_CordRep).storage[2] = '\x01';
    pCVar11->edges_[0] = edge;
    uVar14 = 2;
  }
  OVar17._8_8_ = uVar14;
  OVar17.tree = pCVar11;
  return OVar17;
}

Assistant:

inline OpResult CordRepBtree::AddEdge(bool owned, CordRep* edge, size_t delta) {
  if (size() >= kMaxCapacity) return {New(edge), kPopped};
  OpResult result = ToOpResult(owned);
  result.tree->Add<edge_type>(edge);
  result.tree->length += delta;
  return result;
}